

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3 *psVar1;
  bool bVar2;
  int iVar3;
  Table *pTVar4;
  HashElem *pHVar5;
  Table *pTVar6;
  char *pcVar7;
  char *local_40;
  char *local_38;
  
  psVar1 = pParse->db;
  if (((psVar1->mDbFlags & 0x10) == 0) && (iVar3 = sqlite3ReadSchema(pParse), iVar3 != 0)) {
LAB_00125b6e:
    pTVar4 = (Table *)0x0;
  }
  else {
    pTVar4 = sqlite3FindTable(psVar1,zName,zDbase);
    if (pTVar4 == (Table *)0x0) {
      if (pParse->disableVtab == '\0') {
        pHVar5 = findElementWithHash(&psVar1->aModule,zName,(uint *)0x0);
        pTVar4 = (Table *)pHVar5->data;
        if (pTVar4 == (Table *)0x0) {
          iVar3 = sqlite3_strnicmp(zName,"pragma_",7);
          if (iVar3 == 0) {
            pTVar4 = (Table *)sqlite3PragmaVtabRegister(psVar1,zName);
          }
          else {
            pTVar4 = (Table *)0x0;
          }
        }
        bVar2 = true;
        if (pTVar4 != (Table *)0x0) {
          pcVar7 = pTVar4->zName;
          local_40 = (char *)0x0;
          if (pTVar4->pFKey == (FKey *)0x0) {
            psVar1 = pParse->db;
            if (((*(long *)(pcVar7 + 8) == 0) || (*(long *)(pcVar7 + 8) == *(long *)(pcVar7 + 0x10))
                ) && (local_38 = pcVar7, pTVar6 = (Table *)sqlite3DbMallocZero(psVar1,0x80),
                     pTVar6 != (Table *)0x0)) {
              pcVar7 = sqlite3DbStrDup(psVar1,(char *)pTVar4->aCol);
              pTVar6->zName = pcVar7;
              if (pcVar7 == (char *)0x0) {
                sqlite3DbFreeNN(psVar1,pTVar6);
              }
              else {
                pTVar4->pFKey = (FKey *)pTVar6;
                pTVar6->nTabRef = 1;
                pTVar6->pSchema = psVar1->aDb->pSchema;
                pTVar6->iPKey = -1;
                pcVar7 = sqlite3DbStrDup(psVar1,pcVar7);
                addModuleArgument(pParse,pTVar6,pcVar7);
                addModuleArgument(pParse,pTVar6,(char *)0x0);
                pcVar7 = sqlite3DbStrDup(psVar1,pTVar6->zName);
                addModuleArgument(pParse,pTVar6,pcVar7);
                iVar3 = vtabCallConstructor(psVar1,pTVar6,(Module *)pTVar4,
                                            *(_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                                              **)(local_38 + 0x10),&local_40);
                pcVar7 = local_40;
                if (iVar3 == 0) goto LAB_001259c5;
                sqlite3ErrorMsg(pParse,"%s");
                if (pcVar7 != (char *)0x0) {
                  sqlite3DbFreeNN(psVar1,pcVar7);
                }
                pTVar6 = (Table *)pTVar4->pFKey;
                if (pTVar6 != (Table *)0x0) {
                  *(byte *)&pTVar6->tabFlags = (byte)pTVar6->tabFlags | 2;
                  sqlite3DeleteTable(psVar1,pTVar6);
                  pTVar4->pFKey = (FKey *)0x0;
                }
              }
            }
          }
          else {
LAB_001259c5:
            pTVar4 = (Table *)pTVar4->pFKey;
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return pTVar4;
        }
      }
      if ((flags & 2) != 0) goto LAB_00125b6e;
      pParse->checkSchema = '\x01';
      pTVar4 = (Table *)0x0;
    }
    else if ((pTVar4->nModuleArg != 0) && (pParse->disableVtab != '\0')) {
      pTVar4 = (Table *)0x0;
    }
    if (pTVar4 == (Table *)0x0) {
      pcVar7 = "no such view";
      if ((flags & 1) == 0) {
        pcVar7 = "no such table";
      }
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar7,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar7,zDbase,zName);
      }
    }
  }
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0 
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( pParse->disableVtab==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && pParse->disableVtab ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }

  return p;
}